

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O2

ImageT<unsigned_char,_1U> * __thiscall
ImageT<unsigned_char,_1U>::normalize(ImageT<unsigned_char,_1U> *this)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t i;
  ulong uVar3;
  
  uVar1 = (this->super_Image).height;
  uVar2 = (this->super_Image).width;
  for (uVar3 = 0; uVar1 * uVar2 != uVar3; uVar3 = uVar3 + 1) {
    if ((anon_union_1_2_6556a7fb_for_color<unsigned_char,_1U>_3)this->pixels[uVar3].field_0.comps[0]
        != (anon_union_1_2_6556a7fb_for_color<unsigned_char,_1U>_3)0x0) {
      this->pixels[uVar3].field_0 = (anon_union_1_2_6556a7fb_for_color<unsigned_char,_1U>_3)0xff;
    }
  }
  return this;
}

Assistant:

virtual ImageT& normalize() override {
        uint32_t pixelCount = getPixelCount();
        for (uint32_t i = 0; i < pixelCount; ++i) {
            Color& c = pixels[i];
            c.normalize();
        }
        return *this;
    }